

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

int re2::Regexp::FactorAlternationRecursive(Regexp **sub,int n,ParseFlags altflags,int maxdepth)

{
  Regexp *pRVar1;
  ParseFlags flags;
  bool bVar2;
  uint uVar3;
  Rune *pRVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  ostream *poVar6;
  CharClass *pCVar7;
  Regexp *pRVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  Regexp *b;
  Rune *pRVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ParseFlags runeflags_i;
  int nrune_i;
  Regexp *x [2];
  string local_218;
  CharClassBuilder local_1f8;
  undefined1 local_1b8 [392];
  
  if (maxdepth < 1) {
    return n;
  }
  uVar11 = 0;
  uVar10 = 0;
  if (-1 < n) {
    uVar19 = 0;
    pRVar16 = (Rune *)0x0;
    uVar13 = 0;
    uVar10 = 0;
    uVar14 = 0;
    flags = NoParseFlags;
    do {
      local_1f8.upper_ = 0;
      local_218._M_dataplus._M_p._0_4_ = NoParseFlags;
      if (uVar19 < (uint)n) {
        pRVar4 = LeadingString(sub[uVar19],(int *)&local_1f8,(ParseFlags *)&local_218);
        if ((ParseFlags)local_218._M_dataplus._M_p != flags) goto LAB_00111bda;
        uVar3 = local_1f8.upper_;
        if ((int)uVar13 < (int)local_1f8.upper_) {
          uVar3 = uVar13;
        }
        if ((int)uVar3 < 1) goto LAB_00111bda;
        uVar12 = 0;
        do {
          if (pRVar16[uVar12] != pRVar4[uVar12]) {
            uVar3 = (uint)uVar12;
            break;
          }
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
        if (uVar3 == 0) goto LAB_00111bda;
      }
      else {
        pRVar4 = (Rune *)0x0;
LAB_00111bda:
        iVar15 = (int)uVar14;
        if (uVar19 != uVar14) {
          if (uVar19 == iVar15 + 1) {
            lVar9 = (long)(int)uVar10;
            uVar10 = uVar10 + 1;
            sub[lVar9] = sub[iVar15];
          }
          else {
            local_1b8._0_8_ = LiteralString(pRVar16,uVar13,flags);
            uVar17 = (ulong)iVar15;
            uVar12 = uVar17;
            if ((long)uVar17 < (long)uVar19) {
              do {
                uVar18 = uVar12 + 1;
                RemoveLeadingString(sub[uVar12],uVar13);
                uVar12 = uVar18;
              } while ((uVar18 & 0xffffffff) != uVar19);
            }
            iVar15 = FactorAlternationRecursive
                               (sub + uVar17,(int)uVar19 - iVar15,altflags,maxdepth + -1);
            local_1b8._8_8_ = AlternateNoFactor(sub + uVar17,iVar15,altflags);
            pRVar8 = Concat((Regexp **)local_1b8,2,altflags);
            lVar9 = (long)(int)uVar10;
            uVar10 = uVar10 + 1;
            sub[lVar9] = pRVar8;
          }
        }
        uVar3 = uVar13;
        if (uVar19 < (uint)n) {
          uVar14 = uVar19 & 0xffffffff;
          pRVar16 = pRVar4;
          uVar3 = local_1f8.upper_;
          flags = (ParseFlags)local_218._M_dataplus._M_p;
        }
      }
      uVar13 = uVar3;
      uVar19 = uVar19 + 1;
    } while (uVar19 != n + 1);
    if ((int)uVar10 < 0) {
      uVar11 = 0;
      goto LAB_00111eee;
    }
  }
  uVar14 = 0;
  pRVar8 = (Regexp *)0x0;
  uVar19 = 0;
  do {
    b = pRVar8;
    if (uVar14 < uVar10) {
      pRVar1 = sub[uVar14];
      if (pRVar1->op_ == '\x02') {
        b = (Regexp *)0x0;
      }
      else {
        b = pRVar1;
        if ((pRVar1->op_ == '\x05') && (1 < pRVar1->nsub_)) {
          b = (Regexp *)0x0;
          if ((*(pRVar1->field_5).submany_)->op_ != '\x02') {
            b = *(pRVar1->field_5).submany_;
          }
        }
      }
      if ((pRVar8 == (Regexp *)0x0) || (bVar2 = Equal(pRVar8,b), !bVar2)) goto LAB_00111dad;
      if (8 < pRVar8->op_ - 0xc) {
        if ((pRVar8->op_ == 10) &&
           ((pRVar8->field_7).field_0.min_ == (pRVar8->field_7).field_0.max_)) {
          if (pRVar8->nsub_ < 2) {
            paVar5 = &pRVar8->field_5;
          }
          else {
            paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar8->field_5).submany_;
          }
          if ((paVar5->subone_->op_ < 0x15) &&
             ((0x103008U >> (paVar5->subone_->op_ & 0x1f) & 1) != 0)) goto LAB_00111e82;
        }
        goto LAB_00111dad;
      }
    }
    else {
LAB_00111dad:
      iVar15 = (int)uVar19;
      if (uVar14 != uVar19) {
        if (uVar14 == iVar15 + 1) {
          lVar9 = (long)(int)uVar11;
          uVar11 = uVar11 + 1;
          sub[lVar9] = sub[iVar15];
        }
        else {
          local_1b8._0_8_ = Incref(pRVar8);
          uVar17 = (ulong)iVar15;
          uVar12 = uVar17;
          if ((long)uVar17 < (long)uVar14) {
            do {
              uVar18 = uVar12 + 1;
              pRVar8 = RemoveLeadingRegexp(sub[uVar12]);
              sub[uVar12] = pRVar8;
              uVar12 = uVar18;
            } while ((uVar18 & 0xffffffff) != uVar14);
          }
          iVar15 = FactorAlternationRecursive
                             (sub + uVar17,(int)uVar14 - iVar15,altflags,maxdepth + -1);
          local_1b8._8_8_ = AlternateNoFactor(sub + uVar17,iVar15,altflags);
          pRVar8 = Concat((Regexp **)local_1b8,2,altflags);
          lVar9 = (long)(int)uVar11;
          uVar11 = uVar11 + 1;
          sub[lVar9] = pRVar8;
        }
      }
      pRVar8 = b;
      if (uVar14 < uVar10) {
        uVar19 = uVar14 & 0xffffffff;
      }
    }
LAB_00111e82:
    uVar14 = uVar14 + 1;
  } while (uVar14 != uVar10 + 1);
  if ((int)uVar11 < 0) {
    return 0;
  }
LAB_00111eee:
  uVar14 = 0;
  uVar13 = 0;
  uVar10 = 0;
  do {
    if ((uVar11 <= uVar14) || ((sub[uVar14]->op_ != '\x03' && (sub[uVar14]->op_ != '\x14')))) {
      if (uVar14 != uVar10) {
        if (uVar14 == uVar10 + 1) {
          lVar9 = (long)(int)uVar13;
          uVar13 = uVar13 + 1;
          sub[lVar9] = sub[(int)uVar10];
        }
        else {
          uVar19 = (ulong)(int)uVar10;
          CharClassBuilder::CharClassBuilder(&local_1f8);
          if ((long)uVar19 < (long)uVar14) {
            do {
              pRVar8 = sub[uVar19];
              if (pRVar8->op_ == '\x03') {
                CharClassBuilder::AddRangeFlags
                          (&local_1f8,(pRVar8->field_7).rune_,(pRVar8->field_7).rune_,
                           (uint)pRVar8->parse_flags_);
              }
              else if (pRVar8->op_ == '\x14') {
                pCVar7 = (pRVar8->field_7).field_3.cc_;
                if (*(int *)(pCVar7 + 0x10) != 0) {
                  pRVar16 = *(Rune **)(pCVar7 + 8);
                  do {
                    CharClassBuilder::AddRange(&local_1f8,*pRVar16,pRVar16[1]);
                    pRVar16 = pRVar16 + 2;
                  } while (pRVar16 !=
                           (Rune *)((long)*(int *)(pCVar7 + 0x10) * 8 + *(long *)(pCVar7 + 8)));
                }
              }
              else {
                LogMessage::LogMessage
                          ((LogMessage *)local_1b8,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc"
                           ,0x409,3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b8 + 8),"RE2: unexpected op: ",0x14);
                poVar6 = (ostream *)
                         std::ostream::operator<<((ostream *)(local_1b8 + 8),(uint)pRVar8->op_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                ToString_abi_cxx11_(&local_218,pRVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6,(char *)CONCAT44(local_218._M_dataplus._M_p._4_4_,
                                                   (ParseFlags)local_218._M_dataplus._M_p),
                           local_218._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_218._M_dataplus._M_p._4_4_,
                                (ParseFlags)local_218._M_dataplus._M_p) != &local_218.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_218._M_dataplus._M_p._4_4_,
                                           (ParseFlags)local_218._M_dataplus._M_p));
                }
                LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
              }
              Decref(pRVar8);
              uVar19 = uVar19 + 1;
            } while ((uVar19 & 0xffffffff) != uVar14);
          }
          pCVar7 = CharClassBuilder::GetCharClass(&local_1f8);
          pRVar8 = NewCharClass(pCVar7,altflags);
          lVar9 = (long)(int)uVar13;
          uVar13 = uVar13 + 1;
          sub[lVar9] = pRVar8;
          std::
          _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
          ::~_Rb_tree(&local_1f8.ranges_._M_t);
        }
      }
      if (uVar14 < uVar11) {
        lVar9 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        sub[lVar9] = sub[uVar14];
      }
      uVar10 = (int)uVar14 + 1;
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != uVar11 + 1);
  if ((int)uVar13 < 1) {
    return 0;
  }
  iVar15 = 0;
  uVar14 = 1;
  do {
    pRVar8 = sub[uVar14 - 1];
    if (((uVar14 < uVar13) && (pRVar8->op_ == '\x02')) && (sub[uVar14]->op_ == '\x02')) {
      Decref(pRVar8);
    }
    else {
      lVar9 = (long)iVar15;
      iVar15 = iVar15 + 1;
      sub[lVar9] = pRVar8;
    }
    bVar2 = uVar14 != uVar13;
    uVar14 = uVar14 + 1;
  } while (bVar2);
  return iVar15;
}

Assistant:

int Regexp::FactorAlternationRecursive(
    Regexp** sub, int n,
    Regexp::ParseFlags altflags,
    int maxdepth) {

  if (maxdepth <= 0)
    return n;

  // Round 1: Factor out common literal prefixes.
  Rune *rune = NULL;
  int nrune = 0;
  Regexp::ParseFlags runeflags = Regexp::NoParseFlags;
  int start = 0;
  int out = 0;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that all begin
    // with the string rune[0:nrune].

    Rune* rune_i = NULL;
    int nrune_i = 0;
    Regexp::ParseFlags runeflags_i = Regexp::NoParseFlags;
    if (i < n) {
      rune_i = LeadingString(sub[i], &nrune_i, &runeflags_i);
      if (runeflags_i == runeflags) {
        int same = 0;
        while (same < nrune && same < nrune_i && rune[same] == rune_i[same])
          same++;
        if (same > 0) {
          // Matches at least one rune in current range.  Keep going around.
          nrune = same;
          continue;
        }
      }
    }

    // Found end of a run with common leading literal string:
    // sub[start:i] all begin with rune[0:nrune] but sub[i]
    // does not even begin with rune[0].
    //
    // Factor out common string and append factored expression to sub[0:out].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
      sub[out++] = sub[start];
    } else {
      // Construct factored form: prefix(suffix1|suffix2|...)
      Regexp* x[2];  // x[0] = prefix, x[1] = suffix1|suffix2|...
      x[0] = LiteralString(rune, nrune, runeflags);
      for (int j = start; j < i; j++)
        RemoveLeadingString(sub[j], nrune);
      int nn = FactorAlternationRecursive(sub + start, i - start, altflags,
                                          maxdepth - 1);
      x[1] = AlternateNoFactor(sub + start, nn, altflags);
      sub[out++] = Concat(x, 2, altflags);
    }

    // Prepare for next round (if there is one).
    if (i < n) {
      start = i;
      rune = rune_i;
      nrune = nrune_i;
      runeflags = runeflags_i;
    }
  }
  n = out;

  // Round 2: Factor out common simple prefixes,
  // just the first piece of each concatenation.
  // This will be good enough a lot of the time.
  //
  // Complex subexpressions (e.g. involving quantifiers)
  // are not safe to factor because that collapses their
  // distinct paths through the automaton, which affects
  // correctness in some cases.
  start = 0;
  out = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that all begin with first.

    Regexp* first_i = NULL;
    if (i < n) {
      first_i = LeadingRegexp(sub[i]);
      if (first != NULL && Regexp::Equal(first, first_i) &&
          // first must be an empty-width op
          // OR a char class, any char or any byte
          // OR a fixed repeat of a literal, char class, any char or any byte.
          (first->op() == kRegexpBeginLine ||
           first->op() == kRegexpEndLine ||
           first->op() == kRegexpWordBoundary ||
           first->op() == kRegexpNoWordBoundary ||
           first->op() == kRegexpBeginText ||
           first->op() == kRegexpEndText ||
           first->op() == kRegexpCharClass ||
           first->op() == kRegexpAnyChar ||
           first->op() == kRegexpAnyByte ||
           (first->op() == kRegexpRepeat &&
            first->min() == first->max() &&
            (first->sub()[0]->op() == kRegexpLiteral ||
             first->sub()[0]->op() == kRegexpCharClass ||
             first->sub()[0]->op() == kRegexpAnyChar ||
             first->sub()[0]->op() == kRegexpAnyByte)))) {
        continue;
      }
    }

    // Found end of a run with common leading regexp:
    // sub[start:i] all begin with first but sub[i] does not.
    //
    // Factor out common regexp and append factored expression to sub[0:out].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
      sub[out++] = sub[start];
    } else {
      // Construct factored form: prefix(suffix1|suffix2|...)
      Regexp* x[2];  // x[0] = prefix, x[1] = suffix1|suffix2|...
      x[0] = first->Incref();
      for (int j = start; j < i; j++)
        sub[j] = RemoveLeadingRegexp(sub[j]);
      int nn = FactorAlternationRecursive(sub + start, i - start, altflags,
                                   maxdepth - 1);
      x[1] = AlternateNoFactor(sub + start, nn, altflags);
      sub[out++] = Concat(x, 2, altflags);
    }

    // Prepare for next round (if there is one).
    if (i < n) {
      start = i;
      first = first_i;
    }
  }
  n = out;

  // Round 3: Collapse runs of single literals into character classes.
  start = 0;
  out = 0;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that are either
    // literal runes or character classes.

    if (i < n &&
        (sub[i]->op() == kRegexpLiteral ||
         sub[i]->op() == kRegexpCharClass))
      continue;

    // sub[i] is not a char or char class;
    // emit char class for sub[start:i]...
    if (i == start) {
      // Nothing to do.
    } else if (i == start+1) {
      sub[out++] = sub[start];
    } else {
      // Make new char class.
      CharClassBuilder ccb;
      for (int j = start; j < i; j++) {
        Regexp* re = sub[j];
        if (re->op() == kRegexpCharClass) {
          CharClass* cc = re->cc();
          for (CharClass::iterator it = cc->begin(); it != cc->end(); ++it)
            ccb.AddRange(it->lo, it->hi);
        } else if (re->op() == kRegexpLiteral) {
          ccb.AddRangeFlags(re->rune(), re->rune(), re->parse_flags());
        } else {
          LOG(DFATAL) << "RE2: unexpected op: " << re->op() << " "
                      << re->ToString();
        }
        re->Decref();
      }
      sub[out++] = NewCharClass(ccb.GetCharClass(), altflags);
    }

    // ... and then emit sub[i].
    if (i < n)
      sub[out++] = sub[i];
    start = i+1;
  }
  n = out;

  // Round 4: Collapse runs of empty matches into single empty match.
  start = 0;
  out = 0;
  for (int i = 0; i < n; i++) {
    if (i + 1 < n &&
        sub[i]->op() == kRegexpEmptyMatch &&
        sub[i+1]->op() == kRegexpEmptyMatch) {
      sub[i]->Decref();
      continue;
    }
    sub[out++] = sub[i];
  }
  n = out;

  return n;
}